

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O2

DWORD GetThreadId(HANDLE hThread)

{
  PAL_ERROR PVar1;
  CPalThread *pThread;
  DWORD DVar2;
  IPalObject *local_30;
  IPalObject *pobjThread;
  
  local_30 = (IPalObject *)0x0;
  if (PAL_InitializeChakraCoreCalled) {
    pThread = CorUnix::InternalGetCurrentThread();
    DVar2 = 0;
    PVar1 = CorUnix::InternalGetThreadDataFromHandle(pThread,hThread,0,(CPalThread **)0x0,&local_30)
    ;
    if (PVar1 != 0) {
      DVar2 = (DWORD)pThread->m_threadId;
    }
    if (local_30 != (IPalObject *)0x0) {
      (*local_30->_vptr_IPalObject[8])(local_30,pThread);
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return DVar2;
    }
  }
  abort();
}

Assistant:

DWORD
PALAPI
GetThreadId(
    HANDLE hThread
    // UNIXTODO Should take pThread parameter here (modify callers)
    )
{
    DWORD dwThreadId = 0;
    CPalThread *pThread;
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjThread = 0;

    // TODO: not sure if this could be done in a more efficient way.
    PERF_ENTRY(GetThreadId);
    ENTRY("GetThreadId()\n");

    pThread = InternalGetCurrentThread();

    palError = InternalGetThreadDataFromHandle(
        pThread,
        hThread,
        0,
        0,
        &pobjThread
        );

    if (NO_ERROR != palError)
    {
        dwThreadId = (DWORD)pThread->GetThreadId();
    }

    if (NULL != pobjThread)
    {
        pobjThread->ReleaseReference(pThread);
    }

    LOGEXIT("GetThreadId returns DWORD %#x\n", dwThreadId);
    PERF_EXIT(GetThreadId);

    return dwThreadId;
}